

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O2

bool deqp::egl::operator==(SurfaceConfig *a,SurfaceConfig *b)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color attribute;
  deInt32 dVar2;
  deInt32 dVar3;
  _Base_ptr p_Var4;
  _Self __tmp;
  map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
  defaultRules;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_deqp::egl::AttribRule>,_std::_Select1st<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
  local_60;
  
  SurfaceConfig::getDefaultRules();
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  for (p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    attribute = p_Var4[1]._M_color;
    dVar2 = eglu::ConfigInfo::getAttribute(&a->m_info,attribute);
    dVar3 = eglu::ConfigInfo::getAttribute(&b->m_info,attribute);
    if (dVar2 != dVar3) break;
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_deqp::egl::AttribRule>,_std::_Select1st<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
  ::~_Rb_tree(&local_60);
  return (_Rb_tree_header *)p_Var4 == p_Var1;
}

Assistant:

bool operator== (const SurfaceConfig& a, const SurfaceConfig& b)
	{
		const std::map<EGLenum, AttribRule> defaultRules = getDefaultRules();

		for (std::map<EGLenum, AttribRule>::const_iterator iter = defaultRules.begin(); iter != defaultRules.end(); iter++)
		{
			const EGLenum attribute = iter->first;

			if (a.getAttribute(attribute) != b.getAttribute(attribute)) return false;
		}
		return true;
	}